

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O3

void __thiscall libsgp4::Tle::Initialize(Tle *this)

{
  Tle *pTVar1;
  Tle *pTVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TleException *this_00;
  int iVar4;
  string *this_01;
  string *this_02;
  string *this_03;
  string *this_04;
  string *this_05;
  string *this_06;
  string *this_07;
  string *this_08;
  string *this_09;
  string *this_10;
  string *this_11;
  string *this_12;
  string *this_13;
  string *this_14;
  uint year;
  uint sat_number_2;
  uint sat_number_1;
  double day;
  string local_68;
  uint local_44;
  uint local_40;
  uint local_3c;
  double local_38;
  ulong uVar5;
  
  this_01 = &local_68;
  this_02 = &local_68;
  this_03 = &local_68;
  this_04 = &local_68;
  this_05 = &local_68;
  this_06 = &local_68;
  this_07 = &local_68;
  this_08 = &local_68;
  this_09 = &local_68;
  this_10 = &local_68;
  this_11 = &local_68;
  this_12 = &local_68;
  this_13 = &local_68;
  this_14 = &local_68;
  if (*(long *)(this + 0x28) == 0x45) {
    if (*(long *)(this + 0x48) == 0x45) {
      pTVar1 = this + 0x20;
      if (**(char **)pTVar1 == '1') {
        pTVar2 = this + 0x40;
        if (**(char **)pTVar2 == '2') {
          std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar1);
          ExtractInteger((Tle *)this_01,&local_68,&local_3c);
          paVar3 = &local_68.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar3) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar2);
          ExtractInteger((Tle *)this_02,&local_68,&local_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar3) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if (local_3c == local_40) {
            *(uint *)(this + 0xd0) = local_3c;
            if (*(long *)(this + 8) == 0) {
              std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar1);
              std::__cxx11::string::operator=((string *)this,(string *)&local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != paVar3) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
            }
            std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar1);
            std::__cxx11::string::operator=((string *)(this + 0x60),(string *)&local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar3) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            local_44 = 0;
            local_38 = 0.0;
            std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar1);
            ExtractInteger((Tle *)this_03,&local_68,&local_44);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar3) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar1);
            ExtractDouble((Tle *)this_04,&local_68,4,&local_38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar3) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar1);
            ExtractDouble((Tle *)this_05,&local_68,2,(double *)(this + 0x88));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar3) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar1);
            ExtractExponential((Tle *)this_06,&local_68,(double *)(this + 0x90));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar3) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar1);
            ExtractExponential((Tle *)this_07,&local_68,(double *)(this + 0x98));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar3) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar2);
            ExtractDouble((Tle *)this_08,&local_68,4,(double *)(this + 0xa0));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar3) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar2);
            ExtractDouble((Tle *)this_09,&local_68,4,(double *)(this + 0xa8));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar3) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar2);
            ExtractDouble((Tle *)this_10,&local_68,-1,(double *)(this + 0xb0));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar3) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar2);
            ExtractDouble((Tle *)this_11,&local_68,4,(double *)(this + 0xb8));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar3) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar2);
            ExtractDouble((Tle *)this_12,&local_68,4,(double *)(this + 0xc0));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar3) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar2);
            ExtractDouble((Tle *)this_13,&local_68,3,(double *)(this + 200));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar3) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_68,(ulong)pTVar2);
            ExtractInteger((Tle *)this_14,&local_68,(uint *)(this + 0xd4));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar3) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            iVar4 = local_44 + 2000;
            if (0x38 < local_44) {
              iVar4 = local_44 + 0x76c;
            }
            uVar5 = (ulong)(iVar4 - 1U);
            *(long *)(this + 0x80) =
                 (long)(((double)(long)(uVar5 / 400 +
                                       (((ulong)(iVar4 - 1U >> 2) + uVar5 * 0x16d) - uVar5 / 100)) +
                         local_38 + -1.0) * 86400000000.0);
            return;
          }
          this_00 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(this_00,"Satellite numbers do not match");
        }
        else {
          this_00 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(this_00,"Invalid line beginning for line two");
        }
      }
      else {
        this_00 = (TleException *)__cxa_allocate_exception(0x10);
        TleException::TleException(this_00,"Invalid line beginning for line one");
      }
    }
    else {
      this_00 = (TleException *)__cxa_allocate_exception(0x10);
      TleException::TleException(this_00,"Invalid length for line two");
    }
  }
  else {
    this_00 = (TleException *)__cxa_allocate_exception(0x10);
    TleException::TleException(this_00,"Invalid length for line one");
  }
  __cxa_throw(this_00,&TleException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Tle::IsValidLineLength(const std::string& str)
{
    return str.length() == LineLength() ? true : false;
}